

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_fcos_x86_64(CPUX86State *env)

{
  byte *pbVar1;
  uint uVar2;
  double dVar3;
  floatx80 fVar4;
  
  fVar4._8_4_ = *(undefined4 *)((long)env->fpregs + (ulong)env->fpstt * 0x10 + 8);
  fVar4.low = env->fpregs[env->fpstt].d.low;
  fVar4._12_4_ = 0;
  dVar3 = (double)floatx80_to_float64_x86_64(fVar4,&env->fp_status);
  if (ABS(dVar3) <= 9.223372036854776e+18) {
    uVar2 = env->fpstt;
    dVar3 = cos(dVar3);
    fVar4 = float64_to_floatx80_x86_64((float64)dVar3,&env->fp_status);
    env->fpregs[uVar2].d.low = fVar4.low;
    *(uint16_t *)((long)env->fpregs + (ulong)uVar2 * 0x10 + 8) = fVar4.high;
    pbVar1 = (byte *)((long)&env->fpus + 1);
    *pbVar1 = *pbVar1 & 0xfb;
  }
  else {
    pbVar1 = (byte *)((long)&env->fpus + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void helper_fcos(CPUX86State *env)
{
    double fptemp = floatx80_to_double(env, ST0);

    if ((fptemp > MAXTAN) || (fptemp < -MAXTAN)) {
        env->fpus |= 0x400;
    } else {
        ST0 = double_to_floatx80(env, cos(fptemp));
        env->fpus &= ~0x400;  /* C2 <-- 0 */
        /* the above code is for |arg| < 2**63 only */
    }
}